

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O3

cgltf_size
cgltf_calc_index_bound
          (cgltf_buffer_view *buffer_view,cgltf_size offset,cgltf_component_type component_type,
          cgltf_size count)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  long in_R8;
  
  lVar1 = offset + CONCAT44(in_register_00000014,component_type);
  iVar3 = (int)count;
  if (iVar3 == 2) {
    if (in_R8 == 0) {
      return 0;
    }
    uVar2 = 0;
    lVar4 = 0;
    do {
      uVar5 = (ulong)*(byte *)((long)&buffer_view->buffer + lVar4 + lVar1);
      if (uVar2 <= uVar5) {
        uVar2 = uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (in_R8 != lVar4);
  }
  else if (iVar3 == 4) {
    if (in_R8 == 0) {
      return 0;
    }
    uVar2 = 0;
    lVar4 = 0;
    do {
      uVar5 = (ulong)*(ushort *)((long)&buffer_view->buffer + lVar4 * 2 + lVar1);
      if (uVar2 <= uVar5) {
        uVar2 = uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (in_R8 != lVar4);
  }
  else {
    if ((iVar3 != 5) || (in_R8 == 0)) {
      return 0;
    }
    uVar2 = 0;
    lVar4 = 0;
    do {
      uVar5 = (ulong)*(uint *)((long)&buffer_view->buffer + lVar4 * 4 + lVar1);
      if (uVar2 <= uVar5) {
        uVar2 = uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (in_R8 != lVar4);
  }
  return uVar2;
}

Assistant:

static cgltf_size cgltf_calc_index_bound(cgltf_buffer_view* buffer_view, cgltf_size offset, cgltf_component_type component_type, cgltf_size count)
{
    char* data = (char*)buffer_view->buffer->data + offset + buffer_view->offset;
    cgltf_size bound = 0;

    switch (component_type)
    {
    case cgltf_component_type_r_8u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned char*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    case cgltf_component_type_r_16u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned short*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    case cgltf_component_type_r_32u:
        for (size_t i = 0; i < count; ++i)
        {
            cgltf_size v = ((unsigned int*)data)[i];
            bound = bound > v ? bound : v;
        }
        break;

    default:
        ;
    }

    return bound;
}